

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutTests.cpp
# Opt level: O0

void __thiscall
vkt::ssbo::anon_unknown_0::RandomSSBOLayoutCase::RandomSSBOLayoutCase
          (RandomSSBOLayoutCase *this,TestContext *testCtx,char *name,char *description,
          BufferMode bufferMode,deUint32 features,deUint32 seed)

{
  int iVar1;
  int local_54;
  int ndx;
  int numBlocks;
  undefined1 local_40 [8];
  Random rnd;
  deUint32 features_local;
  BufferMode bufferMode_local;
  char *description_local;
  char *name_local;
  TestContext *testCtx_local;
  RandomSSBOLayoutCase *this_local;
  
  rnd.m_rnd.z = features;
  rnd.m_rnd.w = bufferMode;
  SSBOLayoutCase::SSBOLayoutCase
            (&this->super_SSBOLayoutCase,testCtx,name,description,bufferMode,LOAD_FULL_MATRIX);
  (this->super_SSBOLayoutCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__RandomSSBOLayoutCase_01669460;
  this->m_features = rnd.m_rnd.z;
  this->m_maxBlocks = 4;
  this->m_maxInstances = ((rnd.m_rnd.z & 0x20) >> 5) * 3;
  iVar1 = 1;
  if ((rnd.m_rnd.z & 4) != 0) {
    iVar1 = 8;
  }
  this->m_maxArrayLength = iVar1;
  this->m_maxStructDepth = (rnd.m_rnd.z & 8) >> 2;
  this->m_maxBlockMembers = 5;
  this->m_maxStructMembers = 4;
  this->m_seed = seed;
  this->m_blockNdx = 1;
  this->m_bufferVarNdx = 1;
  this->m_structNdx = 1;
  de::Random::Random((Random *)local_40,this->m_seed);
  iVar1 = de::Random::getInt((Random *)local_40,1,this->m_maxBlocks);
  for (local_54 = 0; local_54 < iVar1; local_54 = local_54 + 1) {
    generateBlock(this,(Random *)local_40,0);
  }
  (*(this->super_SSBOLayoutCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[2])();
  de::Random::~Random((Random *)local_40);
  return;
}

Assistant:

RandomSSBOLayoutCase::RandomSSBOLayoutCase (tcu::TestContext& testCtx, const char* name, const char* description, BufferMode bufferMode, deUint32 features, deUint32 seed)
	: SSBOLayoutCase		(testCtx, name, description, bufferMode, LOAD_FULL_MATRIX)
	, m_features			(features)
	, m_maxBlocks			(4)
	, m_maxInstances		((features & FEATURE_INSTANCE_ARRAYS)	? 3 : 0)
	, m_maxArrayLength		((features & FEATURE_ARRAYS)			? 8 : 1)
	, m_maxStructDepth		((features & FEATURE_STRUCTS)			? 2 : 0)
	, m_maxBlockMembers		(5)
	, m_maxStructMembers	(4)
	, m_seed				(seed)
	, m_blockNdx			(1)
	, m_bufferVarNdx		(1)
	, m_structNdx			(1)
{
	de::Random rnd(m_seed);

	const int numBlocks = rnd.getInt(1, m_maxBlocks);

	for (int ndx = 0; ndx < numBlocks; ndx++)
		generateBlock(rnd, 0);

	init();
}